

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Iterator.h
# Opt level: O2

void __thiscall arangodb::velocypack::ObjectIterator::next(ObjectIterator *this)

{
  ValueLength VVar1;
  uint8_t *local_10;
  
  if (this->_position != this->_size) {
    this->_position = this->_position + 1;
    local_10 = this->_current;
    if (local_10 != (uint8_t *)0x0) {
      VVar1 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::byteSize
                        ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                         &local_10);
      local_10 = this->_current + VVar1;
      this->_current = local_10;
      VVar1 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::byteSize
                        ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                         &local_10);
      this->_current = this->_current + VVar1;
    }
  }
  return;
}

Assistant:

[[nodiscard]] Slice key(bool translate = true) const {
    if (VELOCYPACK_UNLIKELY(!valid())) {
      throw Exception{Exception::IndexOutOfBounds};
    }
    if (_current != nullptr) {
      Slice s{_current};
      return translate ? s.makeKey() : s;
    }
    return _slice.getNthKey(_position, translate);
  }